

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void pacify_shk(monst *shkp)

{
  ulong uVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  
  shkp->field_0x62 = shkp->field_0x62 | 0x40;
  if (*(char *)((long)&shkp[0x1b].meating + 2) != '\0') {
    lVar4 = *(long *)&shkp[0x1b].mnum;
    sVar2 = *(short *)((long)&shkp[0x1b].misc_worn_check + 2);
    *(undefined1 *)((long)&shkp[0x1b].meating + 2) = 0;
    if (0 < sVar2) {
      piVar5 = (int *)(lVar4 + 8);
      iVar6 = sVar2 + 1;
      do {
        iVar3 = *piVar5;
        uVar1 = (long)iVar3 + 3;
        uVar7 = (long)iVar3 + 6;
        if (-1 < (long)uVar1) {
          uVar7 = uVar1;
        }
        *piVar5 = iVar3 - (int)(uVar7 >> 2);
        piVar5 = piVar5 + 4;
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
    }
  }
  return;
}

Assistant:

static void pacify_shk(struct monst *shkp)
{
	NOTANGRY(shkp) = TRUE;	/* make peaceful */
	if (ESHK(shkp)->surcharge) {
		struct bill_x *bp = ESHK(shkp)->bill_p;
		int ct = ESHK(shkp)->billct;

		ESHK(shkp)->surcharge = FALSE;
		while (ct-- > 0) {
			long reduction = (bp->price + 3L) / 4L;
			bp->price -= reduction;		/* undo 33% increase */
			bp++;
		}
	}
}